

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void sym_WriteAnonLabelName(char *buf,uint32_t ofs,bool neg)

{
  char *pcVar1;
  uint local_1c;
  uint32_t id;
  bool neg_local;
  uint32_t ofs_local;
  char *buf_local;
  
  local_1c = 0;
  if (neg) {
    if (anonLabelID < ofs) {
      pcVar1 = "ve";
      if (anonLabelID == 1) {
        pcVar1 = "s";
      }
      error("Reference to anonymous label %u before, when only %u ha%s been created so far\n",
            (ulong)ofs,(ulong)anonLabelID,pcVar1);
    }
    else {
      local_1c = anonLabelID - ofs;
    }
  }
  else if (-anonLabelID - 1 < ofs - 1) {
    error("Reference to anonymous label %u after, when only %u may still be created\n",(ulong)ofs,
          (ulong)(-anonLabelID - 1));
  }
  else {
    local_1c = anonLabelID + (ofs - 1);
  }
  sprintf(buf,"!%u",(ulong)local_1c);
  return;
}

Assistant:

void sym_WriteAnonLabelName(char buf[MIN_NB_ELMS(MAXSYMLEN + 1)], uint32_t ofs, bool neg)
{
	uint32_t id = 0;

	if (neg) {
		if (ofs > anonLabelID)
			error("Reference to anonymous label %" PRIu32 " before, when only %" PRIu32
			      " ha%s been created so far\n",
			      ofs, anonLabelID, anonLabelID == 1 ? "s" : "ve");
		else
			id = anonLabelID - ofs;
	} else {
		ofs--; // We're referencing symbols that haven't been created yet...
		if (ofs > UINT32_MAX - anonLabelID)
			error("Reference to anonymous label %" PRIu32 " after, when only %" PRIu32
			      " may still be created\n", ofs + 1, UINT32_MAX - anonLabelID);
		else
			id = anonLabelID + ofs;
	}

	sprintf(buf, "!%u", id);
}